

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O2

string * __thiscall
yactfr::internal::DsPktProc::toStr_abi_cxx11_
          (string *__return_storage_ptr__,DsPktProc *this,Size indent)

{
  internal *this_00;
  pointer puVar1;
  ErProc *this_01;
  ostream *poVar2;
  Size indent_00;
  Size indent_01;
  Size indent_02;
  Size indent_03;
  unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_> *erProcUp;
  pointer puVar3;
  Size indent_04;
  __node_base *p_Var4;
  ostringstream ss;
  allocator local_293;
  allocator local_292;
  allocator local_291;
  string local_290;
  string *local_270;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  indent_abi_cxx11_(&local_290,(internal *)indent,indent_00);
  poVar2 = std::operator<<((ostream *)local_1a8,(string *)&local_290);
  std::__cxx11::string::string((string *)&local_1e8,"DS packet proc",&local_291);
  anon_unknown_8::_strTopName(&local_1c8,&local_1e8);
  poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
  poVar2 = std::operator<<(poVar2," ");
  std::__cxx11::string::string((string *)&local_228,"dst-id",&local_292);
  _strProp(&local_208,&local_228);
  poVar2 = std::operator<<(poVar2,(string *)&local_208);
  poVar2 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar2);
  poVar2 = std::operator<<(poVar2," ");
  std::__cxx11::string::string((string *)&local_268,"er-align",&local_293);
  _strProp(&local_248,&local_268);
  poVar2 = std::operator<<(poVar2,(string *)&local_248);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_290);
  this_00 = (internal *)(indent + 1);
  indent_abi_cxx11_(&local_290,this_00,indent_01);
  poVar2 = std::operator<<((ostream *)local_1a8,(string *)&local_290);
  poVar2 = std::operator<<(poVar2,"<pkt preamble proc>");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_290);
  indent_04 = indent + 2;
  Proc::toStr_abi_cxx11_(&local_290,&this->_pktPreambleProc,indent_04);
  std::operator<<((ostream *)local_1a8,(string *)&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  indent_abi_cxx11_(&local_290,this_00,indent_02);
  poVar2 = std::operator<<((ostream *)local_1a8,(string *)&local_290);
  poVar2 = std::operator<<(poVar2,"<ER preamble proc>");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_290);
  Proc::toStr_abi_cxx11_(&local_290,&this->_erPreambleProc,indent_04);
  std::operator<<((ostream *)local_1a8,(string *)&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  if (((long)(this->_erProcsVec).
             super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->_erProcsVec).
             super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) +
      (this->_erProcsMap)._M_h._M_element_count != 0) {
    indent_abi_cxx11_(&local_290,this_00,indent_03);
    local_270 = __return_storage_ptr__;
    poVar2 = std::operator<<((ostream *)local_1a8,(string *)&local_290);
    poVar2 = std::operator<<(poVar2,"<ER procs>");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_290);
    puVar1 = (this->_erProcsVec).
             super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (this->_erProcsVec).
                  super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; __return_storage_ptr__ = local_270,
        puVar3 != puVar1; puVar3 = puVar3 + 1) {
      this_01 = (puVar3->_M_t).
                super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                ._M_t.
                super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
                .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl;
      if (this_01 != (ErProc *)0x0) {
        ErProc::toStr_abi_cxx11_(&local_290,this_01,indent_04);
        std::operator<<((ostream *)local_1a8,(string *)&local_290);
        std::__cxx11::string::~string((string *)&local_290);
      }
    }
    p_Var4 = &(this->_erProcsMap)._M_h._M_before_begin;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      ErProc::toStr_abi_cxx11_
                (&local_290,*(ErProc **)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor,
                 indent_04);
      std::operator<<((ostream *)local_1a8,(string *)&local_290);
      std::__cxx11::string::~string((string *)&local_290);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string DsPktProc::toStr(const Size indent) const
{
    std::ostringstream ss;

    ss << internal::indent(indent) << _strTopName("DS packet proc") <<
          " " << _strProp("dst-id") << _dst->id() <<
          " " << _strProp("er-align") << _erAlign << std::endl;
    ss << internal::indent(indent + 1) << "<pkt preamble proc>" << std::endl;
    ss << _pktPreambleProc.toStr(indent + 2);
    ss << internal::indent(indent + 1) << "<ER preamble proc>" << std::endl;
    ss << _erPreambleProc.toStr(indent + 2);

    if (this->erProcsCount() > 0) {
        ss << internal::indent(indent + 1) << "<ER procs>" << std::endl;

        for (const auto& erProcUp : _erProcsVec) {
            if (erProcUp) {
                ss << erProcUp->toStr(indent + 2);
            }
        }

        for (const auto& idErProcUpPair : _erProcsMap) {
            ss << idErProcUpPair.second->toStr(indent + 2);
        }
    }

    return ss.str();
}